

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O2

DdNode * Cudd_SplitSet(DdManager *manager,DdNode *S,DdNode **xVars,int n,double m)

{
  int *piVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  int *piVar5;
  ulong uVar6;
  st__table *table;
  ulong uVar7;
  double max;
  double dVar8;
  DdNode *local_48;
  
  pDVar3 = manager->one;
  pDVar4 = (DdNode *)((ulong)pDVar3 ^ 1);
  if ((m != 0.0) || (NAN(m))) {
    if (pDVar4 != S) {
      uVar2 = manager->size;
      max = ldexp(1.0,n);
      if (m <= max) {
        uVar7 = 0;
        if (0 < (int)uVar2) {
          uVar7 = (ulong)uVar2;
        }
        if (n < 1) {
          n = 0;
        }
        while( true ) {
          manager->reordered = 0;
          piVar5 = (int *)malloc((long)(int)uVar2 << 2);
          if (piVar5 == (int *)0x0) break;
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            piVar5[uVar6] = -1;
          }
          for (uVar6 = 0; (uint)n != uVar6; uVar6 = uVar6 + 1) {
            piVar5[manager->invperm[(int)xVars[uVar6]->index]] = 0;
          }
          if (pDVar3 == S) {
            if ((max == m) && (!NAN(max) && !NAN(m))) {
              free(piVar5);
              return S;
            }
            local_48 = selectMintermsFromUniverse(manager,piVar5,m);
            if (local_48 != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)local_48 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
            }
          }
          else {
            table = st__init_table(st__ptrcmp,st__ptrhash);
            if (table == (st__table *)0x0) {
              fwrite("Cudd_SplitSet: out-of-memory.\n",0x1e,1,(FILE *)manager->out);
              free(piVar5);
              break;
            }
            dVar8 = bddAnnotateMintermCount(manager,S,max,table);
            if ((dVar8 == m) && (!NAN(dVar8) && !NAN(m))) {
              st__foreach(table,cuddStCountfree,(char *)0x0);
              st__free_table(table);
              free(piVar5);
              return S;
            }
            local_48 = cuddSplitSetRecur(manager,table,piVar5,S,m,max,0);
            if (local_48 != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)local_48 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
            }
            st__foreach(table,cuddStCountfree,(char *)0x0);
            st__free_table(table);
          }
          free(piVar5);
          if (manager->reordered != 1) {
            piVar5 = (int *)(((ulong)local_48 & 0xfffffffffffffffe) + 4);
            *piVar5 = *piVar5 + -1;
            return local_48;
          }
        }
        manager->errorCode = CUDD_MEMORY_OUT;
      }
    }
    pDVar4 = (DdNode *)0x0;
  }
  return pDVar4;
}

Assistant:

DdNode *
Cudd_SplitSet(
  DdManager * manager,
  DdNode * S,
  DdNode ** xVars,
  int  n,
  double  m)
{
    DdNode *result;
    DdNode *zero, *one;
    double  max, num;
    st__table *mtable;
    int *varSeen;
    int i,index, size;

    size = manager->size;
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Trivial cases. */
    if (m == 0.0) {
        return(zero);
    }
    if (S == zero) {
        return(NULL);
    }

    max = pow(2.0,(double)n);
    if (m > max)
        return(NULL);

    do {
        manager->reordered = 0;
        /* varSeen is used to mark the variables that are encountered
        ** while traversing the BDD S.
        */
        varSeen = ABC_ALLOC(int, size);
        if (varSeen == NULL) {
            manager->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        for (i = 0; i < size; i++) {
            varSeen[i] = -1;
        }
        for (i = 0; i < n; i++) {
            index = (xVars[i])->index;
            varSeen[manager->invperm[index]] = 0;
        }

        if (S == one) {
            if (m == max) {
                ABC_FREE(varSeen);
                return(S);
            }
            result = selectMintermsFromUniverse(manager,varSeen,m);
            if (result)
                cuddRef(result);
            ABC_FREE(varSeen);
        } else {
            mtable = st__init_table( st__ptrcmp, st__ptrhash);
            if (mtable == NULL) {
                (void) fprintf(manager->out,
                               "Cudd_SplitSet: out-of-memory.\n");
                ABC_FREE(varSeen);
                manager->errorCode = CUDD_MEMORY_OUT;
                return(NULL);
            }
            /* The nodes of BDD S are annotated by the number of minterms
            ** in their onset. The node and the number of minterms in its
            ** onset are stored in mtable.
            */
            num = bddAnnotateMintermCount(manager,S,max,mtable);
            if (m == num) {
                st__foreach(mtable,cuddStCountfree,NIL(char));
                st__free_table(mtable);
                ABC_FREE(varSeen);
                return(S);
            }
            
            result = cuddSplitSetRecur(manager,mtable,varSeen,S,m,max,0);
            if (result)
                cuddRef(result);
            st__foreach(mtable,cuddStCountfree,NULL);
            st__free_table(mtable);
            ABC_FREE(varSeen);
        }
    } while (manager->reordered == 1);

    cuddDeref(result);
    return(result);

}